

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_node<std::istream,short,unsigned_long>
               (IsoHPlane *node,basic_istream<char,_std::char_traits<char>_> *in,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
               vector<char,_std::allocator<char>_> *buffer2,bool diff_endian)

{
  vector<ColType,_std::allocator<ColType>_> *this;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  pointer pCVar1;
  size_t sVar2;
  pointer puVar3;
  pointer vec;
  pointer pvVar4;
  size_t veclen;
  size_t data_sizets [10];
  double data_doubles [5];
  size_t local_b0;
  size_t local_a8;
  size_t sStack_a0;
  size_t local_98;
  size_type local_90;
  size_t local_88;
  size_t local_80;
  size_type local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  double local_58;
  double local_50;
  double dStack_48;
  double local_40;
  double dStack_38;
  
  if (!interrupt_switch) {
    read_bytes<double>(&local_58,5,in);
    if (diff_endian) {
      swap_endianness<double>(&local_58,5);
    }
    node->split_point = local_58;
    node->score = local_50;
    node->range_low = dStack_48;
    node->range_high = local_40;
    node->remainder = dStack_38;
    read_bytes<unsigned_long>(&local_a8,10,in);
    if (diff_endian) {
      swap_endianness<unsigned_long>(&local_a8,10);
    }
    node->hplane_left = local_a8;
    node->hplane_right = sStack_a0;
    read_bytes<unsigned_long>(&node->col_num,local_98,in);
    if (diff_endian) {
      swap_endianness<unsigned_long>
                ((node->col_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start,local_98);
    }
    if (local_90 != 0) {
      this = &node->col_type;
      std::vector<ColType,_std::allocator<ColType>_>::resize(this,local_90);
      if ((node->col_type).super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage !=
          (node->col_type).super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::__shrink_to_fit_aux<std::vector<ColType,_std::allocator<ColType>_>,_true>::_S_do_it
                  (this);
      }
      puVar3 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar3) < local_90) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,local_90 * 2);
        puVar3 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
      }
      read_bytes<unsigned_char>(puVar3,local_90,in);
      if (local_90 != 0) {
        puVar3 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pCVar1 = (this->super__Vector_base<ColType,_std::allocator<ColType>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        sVar2 = 0;
        do {
          pCVar1[sVar2] = (uint)puVar3[sVar2];
          sVar2 = sVar2 + 1;
        } while (local_90 != sVar2);
      }
    }
    read_bytes<double>(&node->coef,local_88,in);
    if (diff_endian) {
      swap_endianness<double>
                ((node->coef).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,local_88);
      read_bytes<double>(&node->mean,local_80,in);
      swap_endianness<double>
                ((node->mean).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,local_80);
    }
    else {
      read_bytes<double>(&node->mean,local_80,in);
    }
    if (local_78 != 0) {
      this_00 = &node->cat_coef;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(this_00,local_78);
      pvVar4 = (node->cat_coef).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (pvVar4 != (node->cat_coef).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        __shrink_to_fit_aux<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_true>
        ::_S_do_it(this_00);
        pvVar4 = (node->cat_coef).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      vec = (this_00->
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
      if (vec != pvVar4) {
        do {
          read_bytes<unsigned_long>(&local_b0,1,in);
          if (diff_endian) {
            deserialize_node<std::istream,short,unsigned_long>();
          }
          else {
            read_bytes<double>(vec,local_b0,in);
          }
          vec = vec + 1;
        } while (vec != pvVar4);
      }
    }
    read_bytes<int,short>(&node->chosen_cat,local_70,in,buffer2,diff_endian);
    read_bytes<double>(&node->fill_val,local_68,in);
    if (diff_endian) {
      swap_endianness<double>
                ((node->fill_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,local_68);
      read_bytes<double>(&node->fill_new,local_60,in);
      swap_endianness<double>
                ((node->fill_new).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,local_60);
    }
    else {
      read_bytes<double>(&node->fill_new,local_60,in);
    }
  }
  return;
}

Assistant:

void deserialize_node(IsoHPlane &node, itype &in, std::vector<uint8_t> &buffer, std::vector<char> &buffer2, const bool diff_endian)
{
    if (interrupt_switch) return;

    double data_doubles[5];
    read_bytes<double, double>((void*)data_doubles, (size_t)5, in, buffer2, diff_endian);
    node.split_point = data_doubles[0];
    node.score = data_doubles[1];
    node.range_low = data_doubles[2];
    node.range_high = data_doubles[3];
    node.remainder = data_doubles[4];

    size_t data_sizets[10];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)10, in, buffer2, diff_endian);

    node.hplane_left = data_sizets[0];
    node.hplane_right = data_sizets[1];

    read_bytes<size_t, saved_size_t>(node.col_num, data_sizets[2], in, buffer2, diff_endian);

    if (data_sizets[3]) {
        node.col_type.resize(data_sizets[3]);
        node.col_type.shrink_to_fit();
        if (buffer.size() < data_sizets[3])
            buffer.resize((size_t)2 * data_sizets[3]);
        read_bytes<uint8_t>((void*)buffer.data(), data_sizets[3], in);
        for (size_t ix = 0; ix < data_sizets[3]; ix++)
            node.col_type[ix] = (ColType)buffer[ix];
    }

    read_bytes<double, double>(node.coef, data_sizets[4], in, buffer2, diff_endian);

    read_bytes<double, double>(node.mean, data_sizets[5], in, buffer2, diff_endian);

    if (data_sizets[6]) {
        node.cat_coef.resize(data_sizets[6]);
        node.cat_coef.shrink_to_fit();
        size_t veclen;
        for (auto &vec : node.cat_coef) {
            read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer2, diff_endian);
            read_bytes<double, double>(vec, veclen, in, buffer2, diff_endian);
        }
    }

    read_bytes<int, saved_int_t>(node.chosen_cat, data_sizets[7], in, buffer2, diff_endian);

    read_bytes<double, double>(node.fill_val, data_sizets[8], in, buffer2, diff_endian);

    read_bytes<double, double>(node.fill_new, data_sizets[9], in, buffer2, diff_endian);
}